

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

size_t __thiscall
CoreML::Specification::MeanVarianceNormalizeLayerParams::ByteSizeLong
          (MeanVarianceNormalizeLayerParams *this)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)((uint)this->acrosschannels_ * 2);
  uVar2 = uVar1 + 2;
  if (this->normalizevariance_ == false) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 + 5;
  if (this->epsilon_ == 0.0) {
    uVar1 = uVar2;
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    uVar1 = uVar1 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)uVar1;
  return uVar1;
}

Assistant:

inline bool MeanVarianceNormalizeLayerParams::_internal_acrosschannels() const {
  return acrosschannels_;
}